

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall duckdb::StatsBindData::~StatsBindData(StatsBindData *this)

{
  ~StatsBindData(this);
  operator_delete(this);
  return;
}

Assistant:

explicit StatsBindData(string stats_p = string()) : stats(std::move(stats_p)) {
	}